

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeMemOpenIpcHandlePrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          ze_ipc_mem_handle_t handle,ze_ipc_memory_flags_t flags,void **pptr)

{
  void **pptr_local;
  ze_ipc_memory_flags_t flags_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  ZEParameterValidation *this_local;
  
  if (hContext == (ze_context_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (hDevice == (ze_device_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (flags < 4) {
    if (pptr == (void **)0x0) {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else {
      this_local._4_4_ = ZE_RESULT_SUCCESS;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeMemOpenIpcHandlePrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to associate with the IPC memory handle
        ze_ipc_mem_handle_t handle,                     ///< [in] IPC memory handle
        ze_ipc_memory_flags_t flags,                    ///< [in] flags controlling the operation.
                                                        ///< must be 0 (default) or a valid combination of ::ze_ipc_memory_flag_t.
        void** pptr                                     ///< [out] pointer to device allocation in this process
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( 0x3 < flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( nullptr == pptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }